

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningPlugin.cpp
# Opt level: O1

void threadsafe_mem_leak_operator_delete(void *mem)

{
  MemoryLeakDetector *pMVar1;
  SimpleMutex *mtx;
  TestMemoryAllocator *allocator;
  MemLeakScopedMutex lock;
  ScopedMutexLock SStack_18;
  
  pMVar1 = MemoryLeakWarningPlugin::getGlobalDetector();
  mtx = MemoryLeakDetector::getMutex(pMVar1);
  ScopedMutexLock::ScopedMutexLock(&SStack_18,mtx);
  pMVar1 = MemoryLeakWarningPlugin::getGlobalDetector();
  MemoryLeakDetector::invalidateMemory(pMVar1,(char *)mem);
  pMVar1 = MemoryLeakWarningPlugin::getGlobalDetector();
  allocator = getCurrentNewAllocator();
  MemoryLeakDetector::deallocMemory(pMVar1,allocator,mem,false);
  ScopedMutexLock::~ScopedMutexLock(&SStack_18);
  return;
}

Assistant:

static void threadsafe_mem_leak_operator_delete (void* mem) UT_NOTHROW
{
    MemLeakScopedMutex lock;
    MemoryLeakWarningPlugin::getGlobalDetector()->invalidateMemory((char*) mem);
    MemoryLeakWarningPlugin::getGlobalDetector()->deallocMemory(getCurrentNewAllocator(), (char*) mem);
}